

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.h
# Opt level: O1

int * __thiscall soplex::DataSet<int>::create(DataSet<int> *this,DataKey *newkey)

{
  int iVar1;
  int iVar2;
  Item *pIVar3;
  uint uVar4;
  
  if ((this->themax ^ this->firstfree) == 0xffffffff) {
    iVar1 = this->thesize;
    this->thesize = iVar1 + 1;
    newkey->idx = iVar1;
  }
  else {
    uVar4 = ~this->firstfree;
    newkey->idx = uVar4;
    this->firstfree = this->theitem[(int)uVar4].info;
  }
  this->thekey[this->thenum] = *newkey;
  iVar1 = this->thenum;
  pIVar3 = this->theitem;
  iVar2 = newkey->idx;
  pIVar3[iVar2].info = iVar1;
  this->thenum = iVar1 + 1;
  return &pIVar3[iVar2].data;
}

Assistant:

DATA* create(DataKey& newkey)
   {
      assert(num() < max());

      if(firstfree != -themax - 1)
      {
         newkey.idx = -firstfree - 1;
         firstfree = theitem[newkey.idx].info;
      }
      else
         newkey.idx = thesize++;

      thekey[thenum] = newkey;
      theitem[newkey.idx].info = thenum;
      ++thenum;

      return &(theitem[newkey.idx].data);
   }